

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *
vkt::shaderexecutor::anon_unknown_0::computeVertexPositions
          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
           *__return_storage_ptr__,int numValues,IVec2 *renderSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  float fVar5;
  Vector<float,_2> local_50;
  float local_48;
  float local_44;
  float fy;
  float fx;
  int iy;
  int ix;
  int valNdx;
  allocator<tcu::Vector<float,_2>_> local_22;
  undefined1 local_21;
  IVec2 *local_20;
  IVec2 *renderSize_local;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *pvStack_10;
  int numValues_local;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *positions;
  
  local_21 = 0;
  local_20 = renderSize;
  renderSize_local._4_4_ = numValues;
  pvStack_10 = __return_storage_ptr__;
  std::allocator<tcu::Vector<float,_2>_>::allocator(&local_22);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (__return_storage_ptr__,(long)numValues,&local_22);
  std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_22);
  for (iy = 0; iVar3 = iy, iy < renderSize_local._4_4_; iy = iy + 1) {
    iVar2 = tcu::Vector<int,_2>::x(local_20);
    iVar1 = iy;
    fx = (float)(iVar3 % iVar2);
    iVar3 = tcu::Vector<int,_2>::x(local_20);
    fy = (float)(iVar1 / iVar3);
    fVar5 = (float)(int)fx;
    iVar3 = tcu::Vector<int,_2>::x(local_20);
    fVar5 = (fVar5 + 0.5) / (float)iVar3;
    local_44 = fVar5 + fVar5 + -1.0;
    fVar5 = (float)(int)fy;
    iVar3 = tcu::Vector<int,_2>::y(local_20);
    fVar5 = (fVar5 + 0.5) / (float)iVar3;
    local_48 = fVar5 + fVar5 + -1.0;
    tcu::Vector<float,_2>::Vector(&local_50,local_44,local_48);
    pvVar4 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       (__return_storage_ptr__,(long)iy);
    *&pvVar4->m_data = local_50.m_data;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<tcu::Vec2> computeVertexPositions (int numValues, const tcu::IVec2& renderSize)
{
	std::vector<tcu::Vec2> positions(numValues);
	for (int valNdx = 0; valNdx < numValues; valNdx++)
	{
		const int		ix		= valNdx % renderSize.x();
		const int		iy		= valNdx / renderSize.x();
		const float		fx		= -1.0f + 2.0f*((float(ix) + 0.5f) / float(renderSize.x()));
		const float		fy		= -1.0f + 2.0f*((float(iy) + 0.5f) / float(renderSize.y()));

		positions[valNdx] = tcu::Vec2(fx, fy);
	}

	return positions;
}